

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_nws_image.cc
# Opt level: O3

void __thiscall NWSImageHandler::handle(NWSImageHandler *this,shared_ptr<const_lrit::File> *f)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  FileWriter *pFVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  _Base_ptr p_Var6;
  char *pcVar7;
  size_t sVar8;
  _Base_ptr p_Var9;
  string *extension;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  NWSImageHandler *this_00;
  NOAALRITHeader NVar10;
  TimeStampHeader TVar11;
  string path;
  unique_ptr<Image,_std::default_delete<Image>_> image;
  tm tm;
  PrimaryHeader ph;
  undefined1 local_370 [40];
  shared_ptr<const_lrit::File> local_348;
  string local_338;
  string local_318;
  undefined1 local_2f8 [32];
  undefined8 local_2d8;
  long lStack_2d0;
  char *local_2c8;
  undefined1 local_298 [32];
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  timespec local_258;
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  PrimaryHeader local_48;
  
  peVar2 = (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  lrit::getHeader<lrit::PrimaryHeader>(&local_48,&peVar2->header_,&peVar2->m_);
  if (local_48.fileType != '\0') {
    return;
  }
  peVar2 = (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  NVar10 = lrit::getHeader<lrit::NOAALRITHeader>(&peVar2->header_,&peVar2->m_);
  if (NVar10.productID != 6) {
    return;
  }
  local_298._0_8_ = local_298 + 0x10;
  local_298._8_8_ = 0;
  local_298[0x10] = '\0';
  local_278._M_p = (pointer)&local_268;
  local_270 = 0;
  local_268._M_local_buf[0] = '\0';
  local_248._M_p = (pointer)&local_238;
  local_258 = (timespec)ZEXT816(0);
  local_240 = 0;
  local_238._M_local_buf[0] = '\0';
  local_228._M_p = (pointer)&local_218;
  local_220 = 0;
  local_218._M_local_buf[0] = '\0';
  local_208._M_p = (pointer)&local_1f8;
  local_200 = 0;
  local_1f8._M_local_buf[0] = '\0';
  local_1e8._M_p = (pointer)&local_1d8;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_1a8._M_p = (pointer)&local_198;
  local_1a0 = 0;
  local_198._M_local_buf[0] = '\0';
  local_188._M_p = (pointer)&local_178;
  local_180 = 0;
  local_178._M_local_buf[0] = '\0';
  local_168._M_p = (pointer)&local_158;
  local_160 = 0;
  local_158._M_local_buf[0] = '\0';
  local_148._M_p = (pointer)&local_138;
  local_140 = 0;
  local_138._M_local_buf[0] = '\0';
  local_128._M_p = (pointer)&local_118;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_108._M_p = (pointer)&local_f8;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  local_e8._M_p = (pointer)&local_d8;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_c8._M_p = (pointer)&local_b8;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_a8._M_p = (pointer)&local_98;
  local_a0 = 0;
  local_98._M_local_buf[0] = '\0';
  local_88._M_p = (pointer)&local_78;
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_68._M_p = (pointer)&local_58;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  this_00 = (NWSImageHandler *)&(this->config_).dir;
  std::__cxx11::string::_M_assign((string *)local_298);
  getBasename_abi_cxx11_
            ((string *)local_2f8,this_00,
             (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::__cxx11::string::operator=((string *)&local_278,(string *)local_2f8);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  _Var5._M_p = local_278._M_p;
  peVar2 = (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var6 = *(_Base_ptr *)((long)&(peVar2->m_)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var1 = &(peVar2->m_)._M_t._M_impl.super__Rb_tree_header;
    p_Var9 = &p_Var1->_M_header;
    do {
      if (4 < (int)p_Var6[1]._M_color) {
        p_Var9 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < 5];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var9 != p_Var1) && ((int)p_Var9[1]._M_color < 6)) {
      TVar11 = lrit::getHeader<lrit::TimeStampHeader>(&peVar2->header_,&peVar2->m_);
      local_2f8._0_8_ = TVar11._0_8_;
      local_2f8._8_4_ = TVar11._8_4_;
      local_258 = lrit::TimeStampHeader::getUnix((TimeStampHeader *)local_2f8);
      goto LAB_001837df;
    }
  }
  local_2d8 = 0;
  lStack_2d0 = 0;
  local_2f8._16_8_ = 0;
  local_2f8._24_8_ = 0;
  local_2f8._0_8_ = (pointer)0x0;
  local_2f8._8_4_ = 0;
  local_2f8._12_4_ = 0;
  local_2c8 = (char *)0x0;
  pcVar7 = strptime(local_278._M_p,"%Y%m%d%H%M%S",(tm *)local_2f8);
  if ((pcVar7 == _Var5._M_p + 0xe) && (*pcVar7 == '-')) {
    local_258.tv_sec = mktime((tm *)local_2f8);
    local_258.tv_nsec = 0;
    local_370._0_8_ = local_370 + 0x10;
    sVar8 = strlen(pcVar7 + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_370,pcVar7 + 1,pcVar7 + sVar8 + 1);
  }
  else {
    local_370._0_8_ = local_370 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_370,local_278._M_p,local_278._M_p + local_270);
  }
  std::__cxx11::string::operator=((string *)&local_278,(string *)local_370);
  if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
    operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
  }
LAB_001837df:
  if ((NVar10._8_8_ & 0xff000000000000) == 0x5000000000000) {
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"gif","");
    extension = &local_318;
    FilenameBuilder::build
              ((string *)local_2f8,(FilenameBuilder *)local_298,&(this->config_).filename,extension)
    ;
    __buf = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      __buf = extraout_RDX_00;
    }
    pFVar3 = (this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lrit::File::read((File *)local_370,
                     (int)(f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr,__buf,(size_t)extension);
    FileWriter::write(pFVar3,(int)local_2f8,local_370,0);
    if ((pointer)local_370._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_370._0_8_,local_370._16_8_ - local_370._0_8_);
    }
    if ((this->config_).json == true) {
      FileWriter::writeHeader
                ((this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 ,(string *)local_2f8);
    }
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
  }
  else {
    local_348.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_348.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_348.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_348.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_348.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_348.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_348.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
    }
    Image::createFromFile((Image *)(local_370 + 0x20),&local_348);
    if (local_348.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_348.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pcVar4 = (this->config_).format._M_dataplus._M_p;
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_338,pcVar4,pcVar4 + (this->config_).format._M_string_length);
    FilenameBuilder::build
              ((string *)local_370,(FilenameBuilder *)local_298,&(this->config_).filename,&local_338
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,
                      (ulong)(local_338.field_2._M_allocated_capacity + 1));
    }
    pFVar3 = (this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    Image::getRawImage((Image *)local_2f8);
    FileWriter::write(pFVar3,(int)local_370,local_2f8,0);
    cv::Mat::~Mat((Mat *)local_2f8);
    if ((this->config_).json == true) {
      FileWriter::writeHeader
                ((this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 ,(string *)local_370);
    }
    if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
      operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
    }
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)(local_370 + 0x20));
  }
  FilenameBuilder::~FilenameBuilder((FilenameBuilder *)local_298);
  return;
}

Assistant:

void NWSImageHandler::handle(std::shared_ptr<const lrit::File> f) {
  auto ph = f->getHeader<lrit::PrimaryHeader>();
  if (ph.fileType != 0) {
    return;
  }

  // Filter NWS
  auto nlh = f->getHeader<lrit::NOAALRITHeader>();
  if (nlh.productID != 6) {
    return;
  }

  FilenameBuilder fb;
  fb.dir = config_.dir;
  fb.filename = getBasename(*f);

  // In the GOES-15 LRIT stream these text files have a time stamp
  // header; in the GOES-R HRIT stream they don't.
  if (f->hasHeader<lrit::TimeStampHeader>()) {
    fb.time = f->getHeader<lrit::TimeStampHeader>().getUnix();
  } else {
    // If time can successfully be extracted from the filename
    // then remove it from the filename passed to the builder.
    fb.filename = parseTime(fb.filename, fb.time);
  }

  // If this is a GIF we can write it directly
  if (nlh.noaaSpecificCompression == 5) {
    auto path = fb.build(config_.filename, "gif");
    fileWriter_->write(path, f->read());
    if (config_.json) {
      fileWriter_->writeHeader(*f, path);
    }
    return;
  }

  auto image = Image::createFromFile(f);
  auto path = fb.build(config_.filename, config_.format);
  fileWriter_->write(path, image->getRawImage());
  if (config_.json) {
    fileWriter_->writeHeader(*f, path);
  }
  return;
}